

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O3

bool __thiscall
moodycamel::ConcurrentQueue<_zframe_t*,MyTraits>::ExplicitProducer::dequeue<_zframe_t*>
          (ExplicitProducer *this,_zframe_t **element)

{
  long lVar1;
  ulong uVar2;
  long *plVar3;
  ExplicitProducer *pEVar4;
  ulong uVar5;
  
  if (0x8000000000000000 <
      (ulong)(*(long *)(this + 0x30) - (*(long *)(this + 0x20) + *(long *)(this + 0x38)))) {
    LOCK();
    pEVar4 = this + 0x30;
    lVar1 = *(long *)pEVar4;
    *(long *)pEVar4 = *(long *)pEVar4 + 1;
    UNLOCK();
    uVar5 = lVar1 - (*(long *)(this + 0x38) + *(long *)(this + 0x20));
    if (uVar5 < 0x8000000000000001) {
      pEVar4 = this + 0x38;
    }
    else {
      LOCK();
      pEVar4 = this + 0x28;
      uVar2 = *(ulong *)pEVar4;
      *(ulong *)pEVar4 = *(ulong *)pEVar4 + 1;
      UNLOCK();
      plVar3 = *(long **)(this + 0x58);
      lVar1 = *(long *)(plVar3[2] + 8 +
                       (*plVar3 - 1U &
                       ((uVar2 & 0xffffffffffffff00) - *(long *)(plVar3[2] + plVar3[1] * 0x10) >> 8)
                       + plVar3[1]) * 0x10);
      *element = *(_zframe_t **)(lVar1 + (uVar2 & 0xff) * 8);
      pEVar4 = (ExplicitProducer *)(lVar1 + 0x808);
    }
    LOCK();
    *(long *)pEVar4 = *(long *)pEVar4 + 1;
    UNLOCK();
    return 0x8000000000000000 < uVar5;
  }
  return false;
}

Assistant:

bool dequeue(U& element)
		{
			auto tail = this->tailIndex.load(std::memory_order_relaxed);
			auto overcommit = this->dequeueOvercommit.load(std::memory_order_relaxed);
			if (details::circular_less_than<index_t>(this->dequeueOptimisticCount.load(std::memory_order_relaxed) - overcommit, tail)) {
				// Might be something to dequeue, let's give it a try
				
				// Note that this if is purely for performance purposes in the common case when the queue is
				// empty and the values are eventually consistent -- we may enter here spuriously.
				
				// Note that whatever the values of overcommit and tail are, they are not going to change (unless we
				// change them) and must be the same value at this point (inside the if) as when the if condition was
				// evaluated.

				// We insert an acquire fence here to synchronize-with the release upon incrementing dequeueOvercommit below.
				// This ensures that whatever the value we got loaded into overcommit, the load of dequeueOptisticCount in
				// the fetch_add below will result in a value at least as recent as that (and therefore at least as large).
				// Note that I believe a compiler (signal) fence here would be sufficient due to the nature of fetch_add (all
				// read-modify-write operations are guaranteed to work on the latest value in the modification order), but
				// unfortunately that can't be shown to be correct using only the C++11 standard.
				// See http://stackoverflow.com/questions/18223161/what-are-the-c11-memory-ordering-guarantees-in-this-corner-case
				std::atomic_thread_fence(std::memory_order_acquire);
				
				// Increment optimistic counter, then check if it went over the boundary
				auto myDequeueCount = this->dequeueOptimisticCount.fetch_add(1, std::memory_order_relaxed);
				
				// Note that since dequeueOvercommit must be <= dequeueOptimisticCount (because dequeueOvercommit is only ever
				// incremented after dequeueOptimisticCount -- this is enforced in the `else` block below), and since we now
				// have a version of dequeueOptimisticCount that is at least as recent as overcommit (due to the release upon
				// incrementing dequeueOvercommit and the acquire above that synchronizes with it), overcommit <= myDequeueCount.
				assert(overcommit <= myDequeueCount);
				
				// Note that we reload tail here in case it changed; it will be the same value as before or greater, since
				// this load is sequenced after (happens after) the earlier load above. This is supported by read-read
				// coherency (as defined in the standard), explained here: http://en.cppreference.com/w/cpp/atomic/memory_order
				tail = this->tailIndex.load(std::memory_order_acquire);
				if (details::likely(details::circular_less_than<index_t>(myDequeueCount - overcommit, tail))) {
					// Guaranteed to be at least one element to dequeue!
					
					// Get the index. Note that since there's guaranteed to be at least one element, this
					// will never exceed tail. We need to do an acquire-release fence here since it's possible
					// that whatever condition got us to this point was for an earlier enqueued element (that
					// we already see the memory effects for), but that by the time we increment somebody else
					// has incremented it, and we need to see the memory effects for *that* element, which is
					// in such a case is necessarily visible on the thread that incremented it in the first
					// place with the more current condition (they must have acquired a tail that is at least
					// as recent).
					auto index = this->headIndex.fetch_add(1, std::memory_order_acq_rel);
					
					
					// Determine which block the element is in
					
					auto localBlockIndex = blockIndex.load(std::memory_order_acquire);
					auto localBlockIndexHead = localBlockIndex->front.load(std::memory_order_acquire);
					
					// We need to be careful here about subtracting and dividing because of index wrap-around.
					// When an index wraps, we need to preserve the sign of the offset when dividing it by the
					// block size (in order to get a correct signed block count offset in all cases):
					auto headBase = localBlockIndex->entries[localBlockIndexHead].base;
					auto blockBaseIndex = index & ~static_cast<index_t>(BLOCK_SIZE - 1);
					auto offset = static_cast<size_t>(static_cast<typename std::make_signed<index_t>::type>(blockBaseIndex - headBase) / BLOCK_SIZE);
					auto block = localBlockIndex->entries[(localBlockIndexHead + offset) & (localBlockIndex->size - 1)].block;
					
					// Dequeue
					auto& el = *((*block)[index]);
					if (!MOODYCAMEL_NOEXCEPT_ASSIGN(T, T&&, element = std::move(el))) {
						// Make sure the element is still fully dequeued and destroyed even if the assignment
						// throws
						struct Guard {
							Block* block;
							index_t index;
							
							~Guard()
							{
								(*block)[index]->~T();
								block->ConcurrentQueue::Block::template set_empty<explicit_context>(index);
							}
						} guard = { block, index };
						
						element = std::move(el);
					}
					else {
						element = std::move(el);
						el.~T();
						block->ConcurrentQueue::Block::template set_empty<explicit_context>(index);
					}
					
					return true;
				}
				else {
					// Wasn't anything to dequeue after all; make the effective dequeue count eventually consistent
					this->dequeueOvercommit.fetch_add(1, std::memory_order_release);		// Release so that the fetch_add on dequeueOptimisticCount is guaranteed to happen before this write
				}
			}
		
			return false;
		}